

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_prior_to_ops(bool walflush)

{
  fdb_status fVar1;
  char *pcVar2;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffff8a8;
  void *in_stack_fffffffffffff8b0;
  fdb_iterator *in_stack_fffffffffffff8b8;
  size_t in_stack_fffffffffffff8d0;
  fdb_doc *in_stack_fffffffffffff900;
  fdb_kvs_handle *in_stack_fffffffffffff908;
  fdb_doc **in_stack_fffffffffffff910;
  fdb_iterator *in_stack_fffffffffffff918;
  fdb_seqnum_t in_stack_fffffffffffff9d0;
  fdb_kvs_handle **in_stack_fffffffffffff9d8;
  fdb_kvs_info *in_stack_fffffffffffffa10;
  fdb_kvs_handle *in_stack_fffffffffffffa18;
  fdb_kvs_config *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  fdb_kvs_handle **in_stack_fffffffffffffa60;
  fdb_file_handle *in_stack_fffffffffffffa68;
  fdb_config *in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  fdb_file_handle **in_stack_fffffffffffffad8;
  fdb_doc *pfStack_400;
  fdb_status status;
  fdb_doc *vdoc;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_kvs_info info;
  fdb_kvs_handle *mirror_kv1;
  fdb_kvs_handle *kv1;
  fdb_iterator *it;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char keybuf [256];
  int local_7c;
  int rb_seqnum;
  int expected_doc_count;
  int n;
  int j;
  int i;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool walflush_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  local_7c = 0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  fdb_kvs_open(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               in_stack_fffffffffffffa50);
  if (walflush) {
    fdb_kvs_open(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                 in_stack_fffffffffffffa50);
  }
  else {
    fdb_kvs_open(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                 in_stack_fffffffffffffa50);
  }
  for (n = 0; n < 100; n = n + 1) {
    sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)n);
    pvVar3 = (void *)0x11a9da;
    strlen(bodybuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                   (size_t)in_stack_fffffffffffff8a8,pvVar3,0,(void *)0x11aa07,
                   in_stack_fffffffffffff8d0);
    fdb_set(mirror_kv1,*(fdb_doc **)(&stack0xfffffffffffff8a8 + (long)n * 8));
    fdb_set((fdb_kvs_handle *)info.file,*(fdb_doc **)(&stack0xfffffffffffff8a8 + (long)n * 8));
    local_7c = local_7c + 1;
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff8a8,'\0');
  for (n = 0; n < 0x32; n = n + 1) {
    fdb_del(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
    fdb_del(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
    local_7c = local_7c + -1;
    fdb_doc_free((fdb_doc *)0x11aae0);
  }
  for (n = 0x32; n < 100; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x11ab15);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff8a8,'\0');
  fdb_get_kvs_info(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  if (info.last_seqnum != (long)local_7c) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xf0b);
    rollback_prior_to_ops::__test_pass = 0;
    if (info.last_seqnum != (long)local_7c) {
      __assert_fail("info.doc_count == (size_t)expected_doc_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xf0b,"void rollback_prior_to_ops(bool)");
    }
  }
  for (expected_doc_count = 0; expected_doc_count < 100; expected_doc_count = expected_doc_count + 1
      ) {
    for (n = 0; n < 100; n = n + 1) {
      sprintf(bodybuf + 0xf8,"key%d",(ulong)(n + 100));
      pvVar3 = (void *)0x11ac2e;
      strlen(bodybuf + 0xf8);
      fdb_doc_create((fdb_doc **)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                     (size_t)in_stack_fffffffffffff8a8,pvVar3,0,(void *)0x11ac5b,
                     in_stack_fffffffffffff8d0);
      fdb_set(mirror_kv1,*(fdb_doc **)(&stack0xfffffffffffff8a8 + (long)n * 8));
      fdb_del(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
      fdb_doc_free((fdb_doc *)0x11acb9);
    }
  }
  if (walflush) {
    fdb_commit((fdb_file_handle *)in_stack_fffffffffffff8a8,'\0');
  }
  else {
    fdb_commit((fdb_file_handle *)in_stack_fffffffffffff8a8,'\0');
  }
  fVar1 = fdb_rollback(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xf25);
    rollback_prior_to_ops::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xf25,"void rollback_prior_to_ops(bool)");
    }
  }
  fdb_get_kvs_info(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  if (info.last_seqnum != (long)local_7c) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xf28);
    rollback_prior_to_ops::__test_pass = 0;
    if (info.last_seqnum != (long)local_7c) {
      __assert_fail("info.doc_count == (size_t)expected_doc_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xf28,"void rollback_prior_to_ops(bool)");
    }
  }
  fdb_get_kvs_info(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  if (info.last_seqnum != (long)local_7c) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xf2a);
    rollback_prior_to_ops::__test_pass = 0;
    if (info.last_seqnum != (long)local_7c) {
      __assert_fail("info.doc_count == (size_t)expected_doc_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xf2a,"void rollback_prior_to_ops(bool)");
    }
  }
  fVar1 = fdb_iterator_sequence_init((fdb_kvs_handle *)info.file,(fdb_iterator **)&kv1,0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xf2d);
    rollback_prior_to_ops::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xf2d,"void rollback_prior_to_ops(bool)");
    }
  }
  do {
    pvVar3 = (void *)0x11af1a;
    fVar1 = fdb_iterator_get_metaonly(in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pvVar3 = (void *)0x11af4d;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xf30);
      rollback_prior_to_ops::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xf30,"void rollback_prior_to_ops(bool)");
      }
    }
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                   (size_t)in_stack_fffffffffffff8a8,pvVar3,sRam0000000000000010,(void *)0x11afd8,
                   in_stack_fffffffffffff8d0);
    fVar1 = fdb_get(mirror_kv1,pfStack_400);
    if ((bRam0000000000000048 & 1) == 0) {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xf39);
        rollback_prior_to_ops::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xf39,"void rollback_prior_to_ops(bool)");
        }
      }
    }
    else if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xf37);
      rollback_prior_to_ops::__test_pass = 0;
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xf37,"void rollback_prior_to_ops(bool)");
      }
    }
    fdb_doc_free((fdb_doc *)0x11b0d8);
    fdb_doc_free((fdb_doc *)0x11b0ef);
    fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffff8a8);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(in_stack_fffffffffffff8b8);
  fdb_kvs_close(in_stack_fffffffffffff8a8);
  fdb_kvs_close(in_stack_fffffffffffff8a8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff8a8);
  fdb_shutdown();
  memleak_end();
  pcVar2 = "normal commit:";
  if (walflush) {
    pcVar2 = "commit with wal flush:";
  }
  sprintf((char *)&dbfile,"rollback prior to ops test %s",pcVar2);
  if (rollback_prior_to_ops::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n",&dbfile);
  }
  else {
    fprintf(_stderr,"%s PASSED\n",&dbfile);
  }
  return;
}

Assistant:

void rollback_prior_to_ops(bool walflush)
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, j, n=100;
    int expected_doc_count = 0;
    int rb_seqnum;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1, *mirror_kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL, *vdoc;
    fdb_status status;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 10;
    fconfig.purging_interval = 1; // retain deletes until compaction

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);

    if(walflush){
        fdb_kvs_open(dbfile, &mirror_kv1, NULL, &kvs_config);
    } else {
        fdb_kvs_open(dbfile, &mirror_kv1, "mirror", &kvs_config);
    }

    // set n docs
    for(i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, NULL, 0);
        fdb_set(kv1, doc[i]);
        fdb_set(mirror_kv1, doc[i]);
        expected_doc_count++;
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // delete subset of recently loaded docs
    for(i=0;i<n/2;++i){
        fdb_del(kv1, doc[i]);
        fdb_del(mirror_kv1, doc[i]);
        expected_doc_count--;
        fdb_doc_free(doc[i]);
    }

    for(i=n/2;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // commit and save seqnum
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);
    rb_seqnum = info.last_seqnum;

    for (j=0;j<100;++j){
        // load some more docs but stop mirroring
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%d", n+i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                NULL, 0, NULL, 0);
            fdb_set(kv1, doc[i]);
            if( n%2 == 0){
                fdb_del(kv1, doc[i]);
            }
            fdb_doc_free(doc[i]);
        }
    }

    // commit wal or normal
    if(walflush){
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    } else {
        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    }

    // rollback
    status = fdb_rollback(&kv1, rb_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);
    fdb_get_kvs_info(mirror_kv1, &info);
    TEST_CHK(info.doc_count == (size_t)expected_doc_count);

    status = fdb_iterator_sequence_init(mirror_kv1, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get_metaonly(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_doc_create(&vdoc, rdoc->key, rdoc->keylen,
                              rdoc->meta, rdoc->metalen,
                              rdoc->body, rdoc->bodylen);
        status = fdb_get(kv1, vdoc);
        if (rdoc->deleted){
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        } else {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
        fdb_doc_free(vdoc);
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(it);
    fdb_kvs_close(mirror_kv1);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    sprintf(bodybuf, "rollback prior to ops test %s",
            walflush ? "commit with wal flush:" : "normal commit:");
    TEST_RESULT(bodybuf);
}